

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::initRep(SPxSolverBase<double> *this,Representation p_rep)

{
  UpdateVector<double> *pUVar1;
  Desc *ds;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar2;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  UpdateVector<double> *pUVar10;
  UpdateVector<double> *pUVar11;
  UpdateVector<double> *pUVar12;
  
  this->theRep = p_rep;
  pUVar1 = &this->addVec;
  if (p_rep == COLUMN) {
    this->thevectors =
         &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>;
    this->thecovectors = (SVSetBase<double> *)this;
    this->theFrhs = &this->primRhs;
    this->theFvec = &this->primVec;
    this->theCoPrhs = &this->dualRhs;
    pUVar10 = &this->dualVec;
    lVar5 = 0x628;
    lVar7 = 0x610;
    lVar8 = 0x658;
    lVar9 = 0x640;
    pUVar11 = pUVar10;
    pUVar12 = pUVar1;
  }
  else {
    this->thevectors = (SVSetBase<double> *)this;
    this->thecovectors =
         &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>;
    this->theFrhs = &this->dualRhs;
    this->theFvec = &this->dualVec;
    this->theCoPrhs = &this->primRhs;
    pUVar10 = &this->primVec;
    lVar5 = 0x658;
    lVar7 = 0x640;
    lVar8 = 0x628;
    lVar9 = 0x610;
    pUVar11 = pUVar1;
    pUVar12 = pUVar10;
  }
  this->theCoPvec = pUVar10;
  this->thePvec = pUVar1;
  this->theRPvec = pUVar11;
  this->theCPvec = pUVar12;
  this->theUbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar9);
  this->theLbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar8);
  this->theCoUbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar7);
  this->theCoLbound =
       (VectorBase<double> *)
       ((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar5);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])(this);
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxBasisBase<double>::reDim(&this->super_SPxBasisBase<double>);
  (this->super_SPxBasisBase<double>).minStab = 0.0;
  ds = &(this->super_SPxBasisBase<double>).thedesc;
  pDVar2 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
  pDVar6 = pDVar2;
  pDVar3 = &ds->rowstat;
  if (((this->super_SPxBasisBase<double>).theLP)->theRep != ROW) {
    pDVar6 = &ds->rowstat;
    pDVar3 = pDVar2;
  }
  (this->super_SPxBasisBase<double>).thedesc.stat = pDVar3;
  (this->super_SPxBasisBase<double>).thedesc.costat = pDVar6;
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    SPxBasisBase<double>::loadDesc(&this->super_SPxBasisBase<double>,ds);
  }
  if ((this->thepricer != (SPxPricer<double> *)0x0) &&
     (iVar4 = (*this->thepricer->_vptr_SPxPricer[3])(),
     (SPxSolverBase<double> *)CONCAT44(extraout_var,iVar4) == this)) {
    (*this->thepricer->_vptr_SPxPricer[8])(this->thepricer,p_rep);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::initRep(Representation p_rep)
   {
      theRep = p_rep;

      if(theRep == COLUMN)
      {
         thevectors   = this->colSet();
         thecovectors = this->rowSet();
         theFrhs      = &primRhs;
         theFvec      = &primVec;
         theCoPrhs    = &dualRhs;
         theCoPvec    = &dualVec;
         thePvec      = &addVec;
         theRPvec     = theCoPvec;
         theCPvec     = thePvec;
         theUbound    = &theUCbound;
         theLbound    = &theLCbound;
         theCoUbound  = &theURbound;
         theCoLbound  = &theLRbound;
      }
      else
      {
         assert(theRep == ROW);

         thevectors   = this->rowSet();
         thecovectors = this->colSet();
         theFrhs      = &dualRhs;
         theFvec      = &dualVec;
         theCoPrhs    = &primRhs;
         theCoPvec    = &primVec;
         thePvec      = &addVec;
         theRPvec     = thePvec;
         theCPvec     = theCoPvec;
         theUbound    = &theURbound;
         theLbound    = &theLRbound;
         theCoUbound  = &theUCbound;
         theCoLbound  = &theLCbound;
      }

      unInit();
      reDim();

      forceRecompNonbasicValue();

      SPxBasisBase<R>::setRep();

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::loadDesc(this->desc());

      if(thepricer && thepricer->solver() == this)
         thepricer->setRep(p_rep);
   }